

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_> __thiscall
kj::
heap<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>,kj::(anonymous_namespace)::InMemoryDirectory_const&,kj::String_const&,kj::Own<kj::File>,kj::WriteMode&>
          (kj *this,InMemoryDirectory *params,String *params_1,Own<kj::File> *params_2,
          WriteMode *params_3)

{
  ReplacerImpl<kj::File> *this_00;
  InMemoryDirectory *directory;
  String *value;
  Own<kj::File> *other;
  WriteMode *pWVar1;
  ReplacerImpl<kj::File> *extraout_RDX;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_> OVar2;
  Own<const_kj::File> local_60 [2];
  ArrayPtr<const_char> local_40;
  WriteMode *local_30;
  WriteMode *params_local_3;
  Own<kj::File> *params_local_2;
  String *params_local_1;
  InMemoryDirectory *params_local;
  
  local_30 = params_3;
  params_local_3 = (WriteMode *)params_2;
  params_local_2 = (Own<kj::File> *)params_1;
  params_local_1 = (String *)params;
  params_local = (InMemoryDirectory *)this;
  this_00 = (ReplacerImpl<kj::File> *)operator_new(0x48);
  directory = fwd<kj::(anonymous_namespace)::InMemoryDirectory_const&>
                        ((InMemoryDirectory *)params_local_1);
  value = fwd<kj::String_const&>((String *)params_local_2);
  StringPtr::StringPtr((StringPtr *)&local_40,value);
  other = fwd<kj::Own<kj::File>>((NoInfer<kj::Own<kj::File>_> *)params_local_3);
  Own<const_kj::File>::Own(local_60,other);
  pWVar1 = fwd<kj::WriteMode&>(local_30);
  anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::File>::ReplacerImpl
            (this_00,directory,(StringPtr)local_40,local_60,*pWVar1);
  Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_>::Own
            ((Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_> *)this,
             this_00,(Disposer *)
                     &_::
                      HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>
                      ::instance);
  Own<const_kj::File>::~Own(local_60);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}